

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_functions.cpp
# Opt level: O0

void Am_Move_Cursor_Right(Am_Object *text)

{
  bool bVar1;
  Am_Code_Flag AVar2;
  Am_Value *pAVar3;
  char *pcVar4;
  char *head;
  long lVar5;
  Am_Object local_58;
  Am_Object local_50;
  Am_String local_48;
  Am_String p;
  int pos;
  Am_Object local_30 [3];
  Am_Object local_18;
  Am_Object *local_10;
  Am_Object *text_local;
  
  local_10 = text;
  Am_Object::Am_Object(&local_18,text);
  AVar2 = ml_which_code(&local_18);
  Am_Object::~Am_Object(&local_18);
  if (AVar2 == Am_ONE_BYTE_CODE) {
    Am_Object::Am_Object(local_30,text);
    Am_Move_Cursor_Right(local_30,1);
    Am_Object::~Am_Object(local_30);
  }
  else if (AVar2 == Am_TWO_BYTE_CODE) {
    Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffc8,text);
    Am_Move_Cursor_Right((Am_Object *)&stack0xffffffffffffffc8,2);
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffc8);
  }
  else if (AVar2 == Am_SHIFT_JIS_CODE) {
    pAVar3 = Am_Object::Get(text,0xad,0);
    p.data._4_4_ = Am_Value::operator_cast_to_int(pAVar3);
    pAVar3 = Am_Object::Get(text,0xab,0);
    Am_String::Am_String(&local_48,pAVar3);
    pcVar4 = Am_String::operator_cast_to_char_(&local_48);
    lVar5 = (long)p.data._4_4_;
    head = Am_String::operator_cast_to_char_(&local_48);
    bVar1 = ml_two_byte_SHIFT_JIS(pcVar4 + lVar5,head);
    if (bVar1) {
      Am_Object::Am_Object(&local_50,text);
      Am_Move_Cursor_Right(&local_50,2);
      Am_Object::~Am_Object(&local_50);
    }
    else {
      Am_Object::Am_Object(&local_58,text);
      Am_Move_Cursor_Right(&local_58,1);
      Am_Object::~Am_Object(&local_58);
    }
    Am_String::~Am_String(&local_48);
  }
  return;
}

Assistant:

void
Am_Move_Cursor_Right(Am_Object text)
{
  switch (ml_which_code(text)) {
  case Am_ONE_BYTE_CODE:
    Am_Move_Cursor_Right(text, 1);
    break;
  case Am_TWO_BYTE_CODE:
    Am_Move_Cursor_Right(text, 2);
    break;
  case Am_SHIFT_JIS_CODE: {
    int pos = text.Get(Am_CURSOR_INDEX);
    Am_String p = text.Get(Am_TEXT);

    if (ml_two_byte_SHIFT_JIS(&(((const char *)p)[pos]), (const char *)p))
      Am_Move_Cursor_Right(text, 2);
    else
      Am_Move_Cursor_Right(text, 1);
    break;
  }
  }
}